

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

bool __thiscall flatbuffers::Parser::ParseJson(Parser *this,char *json,char *json_filename)

{
  bool bVar1;
  byte local_49;
  undefined1 local_36 [15];
  undefined1 local_27 [10];
  bool done;
  int initial_depth;
  char *json_filename_local;
  char *json_local;
  Parser *this_local;
  
  local_27._3_4_ = this->parse_depth_counter_;
  unique0x100000f9 = json_filename;
  json_filename_local = json;
  json_local = (char *)this;
  FlatBufferBuilderImpl<false>::Clear(&this->builder_);
  StartParseFile((Parser *)local_27,(char *)this,json_filename_local);
  bVar1 = CheckedError::Check((CheckedError *)local_27);
  local_49 = 0;
  if (!bVar1) {
    DoParseJson((Parser *)local_36);
    bVar1 = CheckedError::Check((CheckedError *)local_36);
    local_49 = bVar1 ^ 0xff;
    CheckedError::~CheckedError((CheckedError *)local_36);
  }
  CheckedError::~CheckedError((CheckedError *)local_27);
  local_27[2] = local_49 & 1;
  if (local_27._3_4_ == this->parse_depth_counter_) {
    return (bool)local_27[2];
  }
  __assert_fail("initial_depth == parse_depth_counter_",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_parser.cpp"
                ,0xd9c,"bool flatbuffers::Parser::ParseJson(const char *, const char *)");
}

Assistant:

bool Parser::ParseJson(const char *json, const char *json_filename) {
  const auto initial_depth = parse_depth_counter_;
  (void)initial_depth;
  builder_.Clear();
  const auto done =
      !StartParseFile(json, json_filename).Check() && !DoParseJson().Check();
  FLATBUFFERS_ASSERT(initial_depth == parse_depth_counter_);
  return done;
}